

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

uint __thiscall
IRBuilder::ResolveVirtualLongBranch(IRBuilder *this,BranchInstr *branchInstr,uint offset)

{
  BranchInstr *this_00;
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  BailOutKind BVar4;
  undefined4 *puVar5;
  Instr *instr;
  uint offset_00;
  LongBranchMap *this_01;
  uint local_30;
  uint local_2c;
  uint offset_local;
  uint32 targetOffset;
  
  this_01 = this->longBranchMap;
  local_30 = offset;
  if (this_01 == (LongBranchMap *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1c69,"(longBranchMap)","longBranchMap");
    if (!bVar2) goto LAB_00490139;
    *puVar5 = 0;
    this_01 = this->longBranchMap;
  }
  bVar2 = JsUtil::
          BaseDictionary<unsigned_int,_unsigned_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetValue<unsigned_int>(this_01,&local_30,&local_2c);
  if (bVar2) {
    bVar2 = IsLoopBodyOuterOffset(this,local_2c);
    if (bVar2) {
      if ((branchInstr->super_Instr).m_opcode == MultiBr) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0x1c79,"(branchInstr->m_opcode != Js::OpCode::MultiBr)",
                           "branchInstr->m_opcode != Js::OpCode::MultiBr");
        if (!bVar2) goto LAB_00490139;
        *puVar5 = 0;
      }
      bVar2 = IsLoopBodyReturnIPInstr(this,(branchInstr->super_Instr).m_prev);
      if (!bVar2) {
        IR::Instr::GetByteCodeOffset(&branchInstr->super_Instr);
        instr = CreateLoopBodyReturnIPInstr(this,local_2c,offset_00);
        uVar3 = IR::Instr::GetByteCodeOffset(&branchInstr->super_Instr);
        this_00 = (BranchInstr *)this->m_offsetToInstruction[uVar3];
        if ((this_00 != branchInstr) &&
           ((((this_00->super_Instr).field_0x38 & 0x10) == 0 ||
            (BVar4 = IR::Instr::GetBailOutKind((Instr *)this_00), BVar4 != BailOutInjected)))) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                             ,0x1c84,
                             "(this->m_offsetToInstruction[branchInstrByteCodeOffset] == branchInstr || (this->m_offsetToInstruction[branchInstrByteCodeOffset]->HasBailOutInfo() && this->m_offsetToInstruction[branchInstrByteCodeOffset]->GetBailOutKind() == IR::BailOutInjected))"
                             ,
                             "this->m_offsetToInstruction[branchInstrByteCodeOffset] == branchInstr || (this->m_offsetToInstruction[branchInstrByteCodeOffset]->HasBailOutInfo() && this->m_offsetToInstruction[branchInstrByteCodeOffset]->GetBailOutKind() == IR::BailOutInjected)"
                            );
          if (!bVar2) goto LAB_00490139;
          *puVar5 = 0;
        }
        InsertInstr(this,instr,&branchInstr->super_Instr);
      }
      local_2c = GetLoopBodyExitInstrOffset(this);
    }
    return local_2c;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar5 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                     ,0x1c6e,"(false)","false");
  if (bVar2) {
    *puVar5 = 0;
    Js::Throw::FatalInternalError(-0x7fffbffb);
  }
LAB_00490139:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

uint
IRBuilder::ResolveVirtualLongBranch(IR::BranchInstr * branchInstr, uint offset)
{
    Assert(longBranchMap);
    uint32 targetOffset;
    if (!longBranchMap->TryGetValue(offset, &targetOffset))
    {
        // If we see a VirtualLongBranchInstr, we must have a mapping to the real target offset
        Assert(false);
        Fatal();
    }

    //  If this is a jump out of the loop body we need to load the return IP and jump to the loop exit instead
    if (!IsLoopBodyOuterOffset(targetOffset))
    {
        return targetOffset;
    }

    // Multi branch shouldn't be exiting a loop
    Assert(branchInstr->m_opcode != Js::OpCode::MultiBr);

    // Don't load the return IP if it is already loaded (for the case of early exit)
    if (!IsLoopBodyReturnIPInstr(branchInstr->m_prev))
    {
        IR::Instr * returnIPInstr = CreateLoopBodyReturnIPInstr(targetOffset, branchInstr->GetByteCodeOffset());

        // Any jump to this branch to jump to the return IP load instr first
        uint32 branchInstrByteCodeOffset = branchInstr->GetByteCodeOffset();
        Assert(this->m_offsetToInstruction[branchInstrByteCodeOffset] == branchInstr ||
            (this->m_offsetToInstruction[branchInstrByteCodeOffset]->HasBailOutInfo() &&
            this->m_offsetToInstruction[branchInstrByteCodeOffset]->GetBailOutKind() == IR::BailOutInjected));

        InsertInstr(returnIPInstr, branchInstr);
    }
    return GetLoopBodyExitInstrOffset();
}